

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.cpp
# Opt level: O1

void bounce(ItemThing *weap,char *mname,bool noend)

{
  int iVar1;
  int __c;
  
  if (!to_death) {
    if (weap->type == 0x29) {
      addmsg("the %s misses ",weap_info[weap->which].oi_name);
    }
    else {
      addmsg("you missed ");
    }
    addmsg(mname);
    if (!noend) {
      if (save_msg == true) {
        strcpy(huh,msgbuf);
      }
      __c = (int)msgbuf[0];
      iVar1 = islower(__c);
      if (((iVar1 != 0) && (lower_msg == false)) && (msgbuf[1] != ')')) {
        iVar1 = toupper(__c);
        msgbuf[0] = (char)iVar1;
      }
      if (msgbuf[0] != '\0') {
        displayMessage(msgbuf);
      }
      newpos = 0;
      msgbuf[0] = '\0';
      return;
    }
  }
  return;
}

Assistant:

void bounce(ItemThing *weap, const char *mname, bool noend)
{
    if (to_death)
        return;
    if (weap->type == WEAPON)
        addmsg("the %s misses ", weap_info[weap->which].oi_name);
    else
        addmsg("you missed ");
    addmsg(mname);
    if (!noend)
        endmsg();
}